

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopup(ImGuiID id)

{
  bool bVar1;
  
  bVar1 = IsPopupOpen(id);
  if (bVar1) {
    ClosePopupToLevel((GImGui->OpenPopupStack).Size + -1);
    return;
  }
  return;
}

Assistant:

void ImGui::ClosePopup(ImGuiID id)
{
    if (!IsPopupOpen(id))
        return;
    ImGuiContext& g = *GImGui;
    ClosePopupToLevel(g.OpenPopupStack.Size - 1);
}